

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O1

void blake256_compress(state_conflict *S,uint8_t *block)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint32_t m [16];
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  uint auStack_78 [16];
  state_conflict *local_38;
  
  lVar1 = 0;
  do {
    uVar7 = *(uint *)(block + lVar1 * 4);
    auStack_78[lVar1] =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  local_c8 = *(undefined8 *)S->h;
  uStack_c0 = *(undefined8 *)(S->h + 2);
  local_b8 = *(undefined8 *)(S->h + 4);
  uStack_b0 = *(undefined8 *)(S->h + 6);
  local_d0 = S->s[0] ^ 0x243f6a88;
  uStack_a4 = S->s[1] ^ 0x85a308d3;
  uStack_a0 = S->s[2] ^ 0x13198a2e;
  local_e8 = S->s[3] ^ 0x3707344;
  local_a8 = local_d0;
  uStack_9c = local_e8;
  local_98 = 0x299f31d0a4093822;
  uStack_90 = 0xec4e6c89082efa98;
  if (S->nullt == 0) {
    uVar15 = (undefined4)*(undefined8 *)S->t;
    uVar16 = (undefined4)((ulong)*(undefined8 *)S->t >> 0x20);
    local_98 = CONCAT44(uVar15,uVar15) ^ 0x299f31d0a4093822;
    uStack_90 = CONCAT44(uVar16,uVar16) ^ 0xec4e6c89082efa98;
  }
  local_38 = S;
  local_c8._4_4_ = (uint)((ulong)local_c8 >> 0x20);
  local_f4 = local_c8._4_4_;
  local_b8._4_4_ = (uint)((ulong)local_b8 >> 0x20);
  local_ec = local_98._4_4_;
  local_f8 = (uint)uStack_c0;
  local_f0 = (uint)uStack_90;
  uStack_b0._4_4_ = (uint)((ulong)uStack_b0 >> 0x20);
  uStack_c0._4_4_ = (uint)((ulong)uStack_c0 >> 0x20);
  lVar1 = 0xf;
  do {
    uVar2 = (uint)local_c8 + (uint)local_b8 +
            (cst[(byte)(&UNK_00190122)[lVar1]] ^ auStack_78[(byte)(&UNK_00190121)[lVar1]]);
    uVar12 = local_f4 + local_b8._4_4_ +
             (cst[(byte)(&UNK_00190124)[lVar1]] ^ auStack_78[(byte)(&UNK_00190123)[lVar1]]);
    uVar13 = local_f8 + (uint)uStack_b0 +
             (cst[(byte)(&UNK_00190126)[lVar1]] ^ auStack_78[(byte)(&UNK_00190125)[lVar1]]);
    local_98._0_4_ = (uint)local_98 ^ uVar2;
    local_ec = local_ec ^ uVar12;
    uVar7 = uStack_c0._4_4_ + uStack_b0._4_4_ +
            (cst[(byte)(&UNK_00190128)[lVar1]] ^ auStack_78[(byte)(&UNK_00190127)[lVar1]]);
    local_f0 = local_f0 ^ uVar13;
    uStack_90._4_4_ = uStack_90._4_4_ ^ uVar7;
    uVar8 = local_f0 << 0x10 | local_f0 >> 0x10;
    uStack_a0 = uStack_a0 + uVar8;
    uVar11 = uStack_90._4_4_ << 0x10 | uStack_90._4_4_ >> 0x10;
    uStack_b0._0_4_ = (uint)uStack_b0 ^ uStack_a0;
    local_e8 = local_e8 + uVar11;
    uStack_b0._4_4_ = uStack_b0._4_4_ ^ local_e8;
    uVar6 = (uint)uStack_b0 << 0x14 | (uint)uStack_b0 >> 0xc;
    uVar10 = uStack_b0._4_4_ << 0x14 | uStack_b0._4_4_ >> 0xc;
    uVar7 = (cst[(byte)(&UNK_00190127)[lVar1]] ^ auStack_78[(byte)(&UNK_00190128)[lVar1]]) + uVar7 +
            uVar10;
    uVar11 = uVar11 ^ uVar7;
    uVar13 = (cst[(byte)(&UNK_00190125)[lVar1]] ^ auStack_78[(byte)(&UNK_00190126)[lVar1]]) + uVar13
             + uVar6;
    uVar8 = uVar8 ^ uVar13;
    uVar3 = (uint)local_98 << 0x10 | (uint)local_98 >> 0x10;
    local_d0 = local_d0 + uVar3;
    local_b8._0_4_ = (uint)local_b8 ^ local_d0;
    uVar5 = (uint)local_b8 << 0x14 | (uint)local_b8 >> 0xc;
    uVar2 = (cst[(byte)(&UNK_00190121)[lVar1]] ^ auStack_78[(byte)(&UNK_00190122)[lVar1]]) + uVar2 +
            uVar5;
    uVar3 = uVar3 ^ uVar2;
    uVar4 = uVar3 << 0x18 | uVar3 >> 8;
    local_d0 = local_d0 + uVar4;
    uVar5 = uVar5 ^ local_d0;
    uVar9 = uVar8 << 0x18 | uVar8 >> 8;
    uVar5 = uVar5 << 0x19 | uVar5 >> 7;
    uStack_a0 = uStack_a0 + uVar9;
    uVar7 = (cst[sigma[0][lVar1]] ^ auStack_78[(byte)(&UNK_0019012f)[lVar1]]) + uVar7 + uVar5;
    uVar9 = uVar9 ^ uVar7;
    uVar3 = local_ec << 0x10 | local_ec >> 0x10;
    uStack_a4 = uStack_a4 + uVar3;
    local_b8._4_4_ = local_b8._4_4_ ^ uStack_a4;
    uVar14 = local_b8._4_4_ << 0x14 | local_b8._4_4_ >> 0xc;
    uVar8 = (cst[(byte)(&UNK_00190123)[lVar1]] ^ auStack_78[(byte)(&UNK_00190124)[lVar1]]) + uVar12
            + uVar14;
    uVar3 = uVar3 ^ uVar8;
    uVar3 = uVar3 << 0x18 | uVar3 >> 8;
    uVar12 = uVar11 << 0x18 | uVar11 >> 8;
    local_e8 = local_e8 + uVar12;
    uVar10 = uVar10 ^ local_e8;
    uVar11 = uVar10 << 0x19 | uVar10 >> 7;
    uStack_a4 = uStack_a4 + uVar3;
    uVar13 = (cst[(byte)(&UNK_0019012e)[lVar1]] ^ auStack_78[(byte)(&UNK_0019012d)[lVar1]]) + uVar13
             + uVar11;
    uVar3 = uVar3 ^ uVar13;
    uVar14 = uVar14 ^ uStack_a4;
    uVar14 = uVar14 << 0x19 | uVar14 >> 7;
    uVar2 = (cst[(byte)(&UNK_0019012a)[lVar1]] ^ auStack_78[(byte)(&UNK_00190129)[lVar1]]) + uVar2 +
            uVar14;
    uVar12 = uVar12 ^ uVar2;
    uVar6 = uVar6 ^ uStack_a0;
    uVar6 = uVar6 << 0x19 | uVar6 >> 7;
    uVar10 = (cst[(byte)(&UNK_0019012c)[lVar1]] ^ auStack_78[(byte)(&UNK_0019012b)[lVar1]]) + uVar8
             + uVar6;
    uVar4 = uVar4 ^ uVar10;
    uVar8 = uVar9 << 0x10 | uVar9 >> 0x10;
    uStack_a4 = uStack_a4 + uVar8;
    uVar5 = uVar5 ^ uStack_a4;
    uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
    uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
    local_d0 = local_d0 + uVar3;
    uStack_c0._4_4_ =
         (cst[(byte)(&UNK_0019012f)[lVar1]] ^ auStack_78[sigma[0][lVar1]]) + uVar7 + uVar5;
    uVar11 = uVar11 ^ local_d0;
    uVar9 = uVar11 << 0x14 | uVar11 >> 0xc;
    uVar8 = uVar8 ^ uStack_c0._4_4_;
    local_f8 = (cst[(byte)(&UNK_0019012d)[lVar1]] ^ auStack_78[(byte)(&UNK_0019012e)[lVar1]]) +
               uVar13 + uVar9;
    uVar7 = uVar12 << 0x10 | uVar12 >> 0x10;
    uVar3 = uVar3 ^ local_f8;
    uStack_a0 = uStack_a0 + uVar7;
    uVar14 = uVar14 ^ uStack_a0;
    local_f0 = uVar8 << 0x18 | uVar8 >> 8;
    uVar8 = uVar14 << 0x14 | uVar14 >> 0xc;
    local_ec = uVar3 << 0x18 | uVar3 >> 8;
    uStack_a4 = uStack_a4 + local_f0;
    local_c8._0_4_ =
         (cst[(byte)(&UNK_00190129)[lVar1]] ^ auStack_78[(byte)(&UNK_0019012a)[lVar1]]) + uVar2 +
         uVar8;
    uVar7 = uVar7 ^ (uint)local_c8;
    local_d0 = local_d0 + local_ec;
    uStack_90._4_4_ = uVar7 << 0x18 | uVar7 >> 8;
    uStack_a0 = uStack_a0 + uStack_90._4_4_;
    uVar5 = uVar5 ^ uStack_a4;
    uVar7 = uVar4 << 0x10 | uVar4 >> 0x10;
    local_e8 = local_e8 + uVar7;
    uVar9 = uVar9 ^ local_d0;
    uVar6 = uVar6 ^ local_e8;
    uVar13 = uVar6 << 0x14 | uVar6 >> 0xc;
    uVar8 = uVar8 ^ uStack_a0;
    local_f4 = (cst[(byte)(&UNK_0019012b)[lVar1]] ^ auStack_78[(byte)(&UNK_0019012c)[lVar1]]) +
               uVar10 + uVar13;
    uVar7 = uVar7 ^ local_f4;
    local_b8._0_4_ = uVar5 << 0x19 | uVar5 >> 7;
    local_98._0_4_ = uVar7 << 0x18 | uVar7 >> 8;
    uStack_b0._4_4_ = uVar9 << 0x19 | uVar9 >> 7;
    local_e8 = local_e8 + (uint)local_98;
    uVar13 = uVar13 ^ local_e8;
    local_b8._4_4_ = uVar8 << 0x19 | uVar8 >> 7;
    uStack_b0._0_4_ = uVar13 << 0x19 | uVar13 >> 7;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xef);
  local_a8 = local_d0;
  local_c8 = CONCAT44(local_f4,(uint)local_c8);
  local_98 = CONCAT44(local_ec,(uint)local_98);
  uStack_c0 = CONCAT44(uStack_c0._4_4_,local_f8);
  uStack_90 = CONCAT44(uStack_90._4_4_,local_f0);
  uStack_9c = local_e8;
  lVar1 = 0;
  do {
    S->h[(uint)lVar1 & 7] = S->h[(uint)lVar1 & 7] ^ *(uint *)((long)&local_c8 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0;
  do {
    S->h[lVar1] = S->h[lVar1] ^ S->s[(uint)lVar1 & 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

void blake256_compress(state *S, const uint8_t *block) {
    uint32_t v[16], m[16], i;

#define ROT(x,n) (((x)<<(32-n))|((x)>>(n)))
#define G(a,b,c,d,e)                                      \
    v[a] += (m[sigma[i][e]] ^ cst[sigma[i][e+1]]) + v[b]; \
    v[d] = ROT(v[d] ^ v[a],16);                           \
    v[c] += v[d];                                         \
    v[b] = ROT(v[b] ^ v[c],12);                           \
    v[a] += (m[sigma[i][e+1]] ^ cst[sigma[i][e]])+v[b];   \
    v[d] = ROT(v[d] ^ v[a], 8);                           \
    v[c] += v[d];                                         \
    v[b] = ROT(v[b] ^ v[c], 7);

    for (i = 0; i < 16; ++i) m[i] = U8TO32(block + i * 4);
    for (i = 0; i < 8;  ++i) v[i] = S->h[i];
    v[ 8] = S->s[0] ^ 0x243F6A88;
    v[ 9] = S->s[1] ^ 0x85A308D3;
    v[10] = S->s[2] ^ 0x13198A2E;
    v[11] = S->s[3] ^ 0x03707344;
    v[12] = 0xA4093822;
    v[13] = 0x299F31D0;
    v[14] = 0x082EFA98;
    v[15] = 0xEC4E6C89;

    if (S->nullt == 0) {
        v[12] ^= S->t[0];
        v[13] ^= S->t[0];
        v[14] ^= S->t[1];
        v[15] ^= S->t[1];
    }

    for (i = 0; i < 14; ++i) {
        G(0, 4,  8, 12,  0);
        G(1, 5,  9, 13,  2);
        G(2, 6, 10, 14,  4);
        G(3, 7, 11, 15,  6);
        G(3, 4,  9, 14, 14);
        G(2, 7,  8, 13, 12);
        G(0, 5, 10, 15,  8);
        G(1, 6, 11, 12, 10);
    }

    for (i = 0; i < 16; ++i) S->h[i % 8] ^= v[i];
    for (i = 0; i < 8;  ++i) S->h[i] ^= S->s[i % 4];
}